

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstyleditemdelegate.cpp
# Opt level: O0

void __thiscall
QStyledItemDelegate::paint
          (QStyledItemDelegate *this,QPainter *painter,QStyleOptionViewItem *option,
          QModelIndex *index)

{
  QWidget *pQVar1;
  undefined8 in_RCX;
  QStyleOptionViewItem *in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  long in_FS_OFFSET;
  QStyle *style;
  QWidget *widget;
  QStyleOptionViewItem opt;
  QStyleOptionViewItem *in_stack_fffffffffffffed8;
  QStyleOptionViewItem *in_stack_fffffffffffffee0;
  QStyleOptionViewItem *this_00;
  QStyle *local_118;
  QStyleOptionViewItem local_d8;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  memset(&local_d8,0xaa,0xd0);
  QStyleOptionViewItem::QStyleOptionViewItem(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  (**(code **)(*in_RDI + 0xb8))(in_RDI,&local_d8,in_RCX);
  pQVar1 = QStyledItemDelegatePrivate::widget(in_RDX);
  if (pQVar1 == (QWidget *)0x0) {
    local_118 = QApplication::style();
  }
  else {
    local_118 = QWidget::style((QWidget *)in_stack_fffffffffffffed8);
  }
  this_00 = &local_d8;
  (**(code **)(*(long *)local_118 + 0xb8))(local_118,0x2d,this_00,in_RSI,pQVar1);
  QStyleOptionViewItem::~QStyleOptionViewItem(this_00);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QStyledItemDelegate::paint(QPainter *painter,
        const QStyleOptionViewItem &option, const QModelIndex &index) const
{
    Q_ASSERT(index.isValid());

    QStyleOptionViewItem opt = option;
    initStyleOption(&opt, index);

    const QWidget *widget = QStyledItemDelegatePrivate::widget(option);
    QStyle *style = widget ? widget->style() : QApplication::style();
    style->drawControl(QStyle::CE_ItemViewItem, &opt, painter, widget);
}